

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

bool_t derTIsValid(u32 tag)

{
  uint uVar1;
  uint uVar2;
  
  if (tag == 0) {
    return 0;
  }
  if (tag < 0x100) {
    uVar2 = ~tag & 0x1f;
  }
  else {
    if ((char)tag < '\0') {
      return 0;
    }
    uVar1 = tag & 0x7f;
    uVar2 = uVar1;
    while (0xffff < tag) {
      if (-1 < (short)tag) {
        return 0;
      }
      if (0x1ffffff < uVar1) {
        return 0;
      }
      tag = tag >> 8;
      uVar2 = tag & 0x7f;
      uVar1 = uVar1 << 7 | uVar2;
    }
    if ((~tag & 0x1f00) != 0) {
      return 0;
    }
    if (uVar1 < 0x1f) {
      return 0;
    }
  }
  if (uVar2 == 0) {
    return 0;
  }
  return 1;
}

Assistant:

static bool_t derTIsValid(u32 tag)
{
	if (tag == 0)
		return FALSE;
	else if (tag < 256)
	{
		// установлены 5 младших битов?
		if ((tag & 31) == 31)
			return FALSE;
	}
	// длинный код
	else
	{
		u32 t;
		u32 b;
		// установлен старший бит в последнем (младшем) октете?
		if (tag & 128)
			return FALSE;
		// пробегаем ненулевые октеты вплоть до первого (старшего)
		for (b = tag & 127, t = b, tag >>= 8; tag > 255; tag >>= 8)
		{
			// в промежуточном октете снят старший бит?
			// будет переполнение при пересчете тега-как-значения?
			if ((tag & 128) == 0 || (t >> 25) != 0)
				return FALSE;
			// пересчитать тег-как-значение
			b = tag & 127, t = t << 7, t |= b;
		}
		// можно кодировать одним октетом? меньшим числом октетов?
		// в первом (старшем) октете не установлены 5 младших битов?
		if (t < 31 || b == 0 || (tag & 31) != 31)
			return FALSE;
	}
	return TRUE;
}